

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall
tinyusdz::Attribute::set_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
          (Attribute *this,vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *v)

{
  undefined4 *local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  
  if ((this->_type_name)._M_string_length == 0) {
    local_30 = 0x656b6f74;
    local_38 = 7;
    uStack_2c = 0x5d5b6e;
    local_40 = &local_30;
    ::std::__cxx11::string::operator=((string *)&this->_type_name,(string *)&local_40);
    if (local_40 != &local_30) {
      operator_delete(local_40,CONCAT44(uStack_2c,local_30) + 1);
    }
  }
  linb::any::operator=((any *)&this->_var,v);
  return;
}

Assistant:

void set_value(const T &v) {
    if (_type_name.empty()) {
      _type_name = value::TypeTraits<T>::type_name();
    }
    _var.set_value(v);
  }